

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t setup_suitable_read_buffer(archive_read_disk *a)

{
  filesystem *pfVar1;
  uchar *puVar2;
  ulong local_50;
  ulong local_48;
  long incr;
  long xfer_align;
  size_t s;
  size_t asize;
  filesystem *cf;
  tree *t;
  archive_read_disk *a_local;
  
  pfVar1 = a->tree->current_filesystem;
  if (pfVar1->allocation_ptr == (uchar *)0x0) {
    if (pfVar1->xfer_align == -1) {
      local_50 = 0x1000;
    }
    else {
      local_50 = pfVar1->xfer_align;
    }
    if (pfVar1->max_xfer_size == -1) {
      local_48 = pfVar1->incr_xfer_size;
      if ((long)local_48 < 0) {
        local_48 = pfVar1->min_xfer_size;
      }
      if (pfVar1->min_xfer_size < 0) {
        local_48 = local_50;
        s = local_50;
      }
      else {
        s = pfVar1->min_xfer_size;
      }
      for (; s < 0x10000; s = local_48 + s) {
      }
    }
    else {
      s = pfVar1->max_xfer_size;
    }
    s = s + local_50;
    puVar2 = (uchar *)malloc(s);
    pfVar1->allocation_ptr = puVar2;
    if (pfVar1->allocation_ptr == (uchar *)0x0) {
      archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory");
      (a->archive).state = 0x8000;
      return L'\xffffffe2';
    }
    xfer_align = (ulong)pfVar1->allocation_ptr % local_50;
    if (xfer_align != 0) {
      xfer_align = local_50 - xfer_align;
    }
    pfVar1->buff = pfVar1->allocation_ptr + xfer_align;
    pfVar1->buff_size = s - local_50;
  }
  return L'\0';
}

Assistant:

static int
setup_suitable_read_buffer(struct archive_read_disk *a)
{
	struct tree *t = a->tree;
	struct filesystem *cf = t->current_filesystem;
	size_t asize;
	size_t s;

	if (cf->allocation_ptr == NULL) {
		/* If we couldn't get a filesystem alignment,
		 * we use 4096 as default value but we won't use
		 * O_DIRECT to open() and openat() operations. */
		long xfer_align = (cf->xfer_align == -1)?4096:cf->xfer_align;

		if (cf->max_xfer_size != -1)
			asize = cf->max_xfer_size + xfer_align;
		else {
			long incr = cf->incr_xfer_size;
			/* Some platform does not set a proper value to
			 * incr_xfer_size.*/
			if (incr < 0)
				incr = cf->min_xfer_size;
			if (cf->min_xfer_size < 0) {
				incr = xfer_align;
				asize = xfer_align;
			} else
				asize = cf->min_xfer_size;

			/* Increase a buffer size up to 64K bytes in
			 * a proper incremant size. */
			while (asize < 1024*64)
				asize += incr;
			/* Take a margin to adjust to the filesystem
			 * alignment. */
			asize += xfer_align;
		}
		cf->allocation_ptr = malloc(asize);
		if (cf->allocation_ptr == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't allocate memory");
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}

		/*
		 * Calculate proper address for the filesystem.
		 */
		s = (uintptr_t)cf->allocation_ptr;
		s %= xfer_align;
		if (s > 0)
			s = xfer_align - s;

		/*
		 * Set a read buffer pointer in the proper alignment of
		 * the current filesystem.
		 */
		cf->buff = cf->allocation_ptr + s;
		cf->buff_size = asize - xfer_align;
	}
	return (ARCHIVE_OK);
}